

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTexCube
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  uint uVar1;
  TestLog *log;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int width;
  CubeFace face;
  ContextWrapper *this_00;
  allocator<char> local_f1;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  CompareLogMode local_e0;
  CubeFace local_dc;
  ContextWrapper *local_d8;
  ReferenceContext *local_d0;
  GLContext *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Surface result;
  Surface reference;
  string local_50;
  
  local_ec = 1;
  if ((this->m_flags & 1) != 0) {
    uVar1 = this->m_width;
    uVar3 = 0x20;
    uVar5 = uVar3;
    if (uVar1 != 0) {
      uVar5 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    uVar1 = this->m_height;
    if (uVar1 != 0) {
      uVar3 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_ec = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar5)) {
      local_ec = 0x1f - uVar5;
    }
    local_ec = local_ec + 1;
  }
  this_00 = &this->super_ContextWrapper;
  local_e8 = 0;
  local_d8 = this_00;
  local_d0 = refContext;
  local_c8 = gles2Context;
  do {
    if (local_e8 == local_ec) {
      return;
    }
    iVar4 = this->m_width >> ((byte)local_e8 & 0x1f);
    local_e4 = 1;
    if (1 < iVar4) {
      local_e4 = iVar4;
    }
    iVar6 = this->m_height >> ((byte)local_e8 & 0x1f);
    local_f0 = 1;
    if (1 < iVar6) {
      local_f0 = iVar6;
    }
    local_e0 = COMPARE_LOG_ON_ERROR - (local_e8 == 0);
    width = local_e4;
    for (face = CUBEFACE_NEGATIVE_X; face != CUBEFACE_LAST; face = face + CUBEFACE_POSITIVE_X) {
      tcu::Surface::Surface(&reference);
      tcu::Surface::Surface(&result);
      if (2 < iVar6 && 2 < iVar4) {
        sglr::ContextWrapper::setContext(this_00,&local_c8->super_Context);
        renderTexCube(this,&result,width,local_f0,face);
        sglr::ContextWrapper::setContext(this_00,&local_d0->super_Context);
        renderTexCube(this,&reference,width,local_f0,face);
        log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Image comparison result: ",&local_f1);
        local_dc = face;
        de::toString<tcu::CubeFace>(&local_50,&local_dc);
        std::operator+(&local_a0,&local_c0,&local_50);
        bVar2 = tcu::fuzzyCompare(log,"Result",local_a0._M_dataplus._M_p,&reference,&result,0.02,
                                  local_e0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c0);
        this_00 = local_d8;
        width = local_e4;
        if (!bVar2) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed");
          tcu::Surface::~Surface(&result);
          tcu::Surface::~Surface(&reference);
          return;
        }
      }
      tcu::Surface::~Surface(&result);
      tcu::Surface::~Surface(&reference);
    }
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

void TextureSpecCase::verifyTexCube (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_CUBE);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int		levelW	= de::max(1, m_width >> levelNdx);
		int		levelH	= de::max(1, m_height >> levelNdx);
		bool	isOk	= true;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			if (levelW <= 2 || levelH <= 2)
				continue; // Don't bother checking.

			// Render with GLES2
			setContext(&gles2Context);
			renderTexCube(result, levelW, levelH, (tcu::CubeFace)face);

			// Render reference.
			setContext(&refContext);
			renderTexCube(reference, levelW, levelH, (tcu::CubeFace)face);

			const float	threshold	= 0.02f;
			isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Result", (string("Image comparison result: ") + de::toString((tcu::CubeFace)face)).c_str(), reference, result, threshold,
									 levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}

		if (!isOk)
			break;
	}
}